

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
               (int (*expected) [35],vector<int,_std::allocator<int>_> *actual,
               LocationInfo *location)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *__first1;
  bool value;
  const_iterator cVar2;
  const_iterator __last;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  vector<int,_std::allocator<int>_> *actual_local;
  int (*expected_local) [35];
  
  local_30[1] = 0x23;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (vector<int,_std::allocator<int>_> *)expected;
  cVar2 = std::vector<int,_std::allocator<int>_>::begin(actual);
  __last = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)location_local);
  local_30[0] = std::
                distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                           cVar2._M_current,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __last._M_current);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  pvVar1 = actual_local + 5;
  cVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)location_local);
  value = std::
          equal<int*,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    ((int *)__first1,
                     (int *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 4),
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                     cVar2._M_current);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}